

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordwrap.c
# Opt level: O3

void wordwrap(BinarySink *bs,ptrlen input,size_t maxwid)

{
  ulong uVar1;
  uchar val;
  long lVar2;
  ptrlen pl;
  ptrlen local_40;
  
  local_40.len = input.len;
  local_40.ptr = input.ptr;
  pl = ptrlen_get_word(&local_40," ");
  if (pl.len != 0) {
    lVar2 = 0;
    do {
      if (lVar2 == 0) {
        lVar2 = 0;
      }
      else {
        uVar1 = pl.len + lVar2 + 1;
        lVar2 = lVar2 + 1;
        if (maxwid < uVar1) {
          lVar2 = 0;
        }
        val = ' ';
        if (maxwid < uVar1) {
          val = '\n';
        }
        BinarySink_put_byte(bs->binarysink_,val);
      }
      BinarySink_put_datapl(bs->binarysink_,pl);
      lVar2 = lVar2 + pl.len;
      pl = ptrlen_get_word(&local_40," ");
    } while (pl.len != 0);
  }
  return;
}

Assistant:

void wordwrap(BinarySink *bs, ptrlen input, size_t maxwid)
{
    size_t col = 0;
    while (true) {
        ptrlen word = ptrlen_get_word(&input, " ");
        if (!word.len)
            break;

        /* At the start of a line, any word is legal, even if it's
         * overlong, because we have to display it _somehow_ and
         * wrapping to the next line won't make it any better. */
        if (col > 0) {
            size_t newcol = col + 1 + word.len;
            if (newcol <= maxwid) {
                put_byte(bs, ' ');
                col++;
            } else {
                put_byte(bs, '\n');
                col = 0;
            }
        }

        put_datapl(bs, word);
        col += word.len;
    }
}